

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task1-5.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  istream *piVar2;
  double local_70;
  double t0;
  double v0;
  double x0;
  double g;
  int local_48;
  int temp;
  int x;
  int z;
  double w2;
  double q2;
  int w;
  int q;
  double b2;
  double a2;
  undefined4 local_10;
  int b;
  int a;
  
  b = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_682);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6a5);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,6);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6bb);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_10 = 3;
  a2._4_4_ = 3;
  b2 = 3.0;
  _w = 3.14;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,a2._4_4_);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,b2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,_w);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6c5);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)((long)&q2 + 4));
  piVar2 = (istream *)std::istream::operator>>(piVar2,(int *)&q2);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&w2);
  std::istream::operator>>(piVar2,(double *)&x);
  poVar1 = std::operator<<((ostream *)&std::cout,"int; int  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,q2._4_4_ + q2._0_4_);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,q2._4_4_ - q2._0_4_);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,q2._4_4_ * q2._0_4_);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,q2._4_4_ / q2._0_4_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"double; double  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,w2 + _x);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,w2 - _x);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,w2 * _x);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,w2 / _x);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"int; double  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)q2._4_4_ + _x);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)q2._4_4_ - _x);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)q2._4_4_ * _x);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)q2._4_4_ / _x);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"double; int  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,w2 + (double)q2._0_4_);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,w2 - (double)q2._0_4_);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,w2 * (double)q2._0_4_);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,w2 / (double)q2._0_4_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_71b);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&temp);
  std::istream::operator>>(piVar2,&local_48);
  local_48 = temp;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,temp);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_48);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_48 = temp - local_48;
  temp = temp - local_48;
  local_48 = temp + local_48;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,temp);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_48);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_731);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  x0 = -9.8;
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&v0);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&t0);
  std::istream::operator>>(piVar2,&local_70);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,t0 * local_70 + v0 + (local_70 * -9.8 * local_70) / 2.0)
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int
main (void)
{
    // первая задача
    cout << "Первая задача" << endl;
    cout << "Реезультат вычисления 2 + 2 * 2 = " << 2 + 2 * 2 << endl;

    // вторая задача
    cout << "Вторая задача" << endl;
    int a = 3, b = 3.999;

    double a2 = 3, b2 = 3.14;

    cout << a << endl << b << endl << a2 << endl << b2 << endl;

    // третья задача
    cout << "Третья задача" << endl;
    int q,w;
    double q2, w2;
    cin >> q >> w >> q2 >> w2;
    cout << "int; int  " << q + w << ' ' << q - w << ' ' << q*w << ' '  << q/w << endl;
    cout << "double; double  " << q2 + w2 << ' ' << q2 - w2 << ' ' << q2*w2 << ' ' << q2/w2 << endl;
    cout << "int; double  " << q + w2 << ' ' << q - w2 << ' ' << q*w2 << ' ' << q/w2 << endl;
    cout << "double; int  "<< q2 + w << ' ' << q2 - w << ' ' << q2*w << ' ' << q2/w << endl;

    // четвертая задача
    cout << "Четвертая задача" << endl;
    int z,x, temp;
    cin >> z >> x;
    x = z;
    z = x;

    cout << z << ' ' << x << endl;
    x = z -x;
    z = z -x;
    x = z + x;

    cout << z << ' ' << x << endl;

    // пятая задача
    cout << "Пятая задача" << endl;
    const double g = -9.8;
    double x0, v0, t0;
    cin >> x0 >> v0 >> t0;
    cout <<x0 + v0*t0 + g*t0*t0/2 << endl;

    return 0;
}